

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

void ungroup_objects_internal
               (Am_Object *cmd,Am_Object *selection_widget,Am_Value_List *selected_objs,
               Am_Object *group)

{
  bool bVar1;
  int left_offset;
  int top_offset;
  Am_Wrapper *pAVar2;
  Am_Value *pAVar3;
  Am_Object local_f8;
  Am_Object place;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Value_List sub_group_parts;
  Am_Object sub_group;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Value_List new_selected_objs;
  Am_Object obj;
  Am_Value_List selected_objs_places;
  Am_Object local_68;
  Am_Value_List local_60;
  Am_Value_List local_50;
  Am_Value_List local_40;
  
  obj.data = (Am_Object_Data *)0x0;
  place.data = (Am_Object_Data *)0x0;
  sub_group.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&selected_objs_places);
  Am_Value_List::Am_Value_List(&sub_group_parts);
  Am_Value_List::Am_Value_List(&new_selected_objs);
  Am_Object::Am_Object(&local_d8,cmd);
  Am_Get_Selection_Widget_For_Command(&local_f8);
  Am_Object::operator=(selection_widget,&local_f8);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::~Am_Object(&local_d8);
  Am_Object::Am_Object(&local_e0,selection_widget);
  Am_Get_Selection_In_Display_Order(&local_e0,selected_objs,group);
  Am_Object::~Am_Object(&local_e0);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(selected_objs);
  Am_Object::Set(cmd,0x16d,pAVar2,0);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(group);
  Am_Object::Set(cmd,0x171,pAVar2,0);
  Am_Object::Set(cmd,0x16f,false,0);
  Am_Value_List::Start(selected_objs);
  while( true ) {
    bVar1 = Am_Value_List::Last(selected_objs);
    if (bVar1) break;
    pAVar3 = Am_Value_List::Get(selected_objs);
    Am_Object::operator=(&sub_group,pAVar3);
    pAVar3 = Am_Object::Get(&sub_group,100,0);
    left_offset = Am_Value::operator_cast_to_int(pAVar3);
    pAVar3 = Am_Object::Get(&sub_group,0x65,0);
    top_offset = Am_Value::operator_cast_to_int(pAVar3);
    Am_Object::Am_Object(&local_e8,&sub_group);
    Am_Object::Am_Object(&local_98,group);
    Am_Find_Part_Place(&local_f8,&local_e8);
    Am_Object::operator=(&place,&local_f8);
    Am_Object::~Am_Object(&local_f8);
    Am_Object::~Am_Object(&local_98);
    Am_Object::~Am_Object(&local_e8);
    pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&place);
    Am_Value_List::Add(&selected_objs_places,pAVar2,Am_TAIL,true);
    pAVar3 = Am_Object::Get(&sub_group,0x82,0);
    Am_Value_List::operator=(&sub_group_parts,pAVar3);
    pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&sub_group_parts);
    Am_Object::Set(&sub_group,0x1e4,pAVar2,1);
    Am_Value_List::Am_Value_List(&local_40,&sub_group_parts);
    adjust_objects_positions(&local_40,left_offset,top_offset);
    Am_Value_List::~Am_Value_List(&local_40);
    Am_Value_List::Am_Value_List(&local_50,&sub_group_parts);
    Am_Object::Am_Object(&local_a0,&sub_group);
    Am_Object::Am_Object(&local_a8,group);
    Am_Object::Am_Object(&local_68,&place);
    remove_and_add_objects(&local_50,&local_a0,&local_a8,&local_68);
    Am_Object::~Am_Object(&local_68);
    Am_Object::~Am_Object(&local_a8);
    Am_Object::~Am_Object(&local_a0);
    Am_Value_List::~Am_Value_List(&local_50);
    Am_Value_List::Am_Value_List(&local_60,&sub_group_parts);
    Am_Value_List::Append(&new_selected_objs,&local_60,true);
    Am_Value_List::~Am_Value_List(&local_60);
    Am_Object::Am_Object(&local_b0,&sub_group);
    Am_Object::Remove_Part(group,&local_b0);
    Am_Object::~Am_Object(&local_b0);
    Am_Value_List::Next(selected_objs);
  }
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&selected_objs_places);
  Am_Object::Set(cmd,0x1e4,pAVar2,0);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_selected_objs);
  Am_Object::Set(cmd,0x169,pAVar2,0);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_selected_objs);
  Am_Object::Set(selection_widget,0x169,pAVar2,0);
  Am_Value_List::~Am_Value_List(&new_selected_objs);
  Am_Value_List::~Am_Value_List(&sub_group_parts);
  Am_Value_List::~Am_Value_List(&selected_objs_places);
  Am_Object::~Am_Object(&sub_group);
  Am_Object::~Am_Object(&place);
  Am_Object::~Am_Object(&obj);
  return;
}

Assistant:

void
ungroup_objects_internal(Am_Object &cmd, Am_Object &selection_widget,
                         Am_Value_List &selected_objs, Am_Object &group)
{
  Am_Object obj, place, sub_group;
  int left, top;
  Am_Value_List selected_objs_places, sub_group_parts, new_selected_objs;
  selection_widget = Am_Get_Selection_Widget_For_Command(cmd);
  Am_Get_Selection_In_Display_Order(selection_widget, selected_objs, group);
  cmd.Set(Am_OBJECT_MODIFIED, selected_objs);
  cmd.Set(Am_SAVED_OLD_OBJECT_OWNER, group);
  cmd.Set(Am_HAS_BEEN_UNDONE, false);

  for (selected_objs.Start(); !selected_objs.Last(); selected_objs.Next()) {
    sub_group = selected_objs.Get();
    left = sub_group.Get(Am_LEFT);
    top = sub_group.Get(Am_TOP);
    place = Am_Find_Part_Place(sub_group, group);
    selected_objs_places.Add(place);

    // now take out the pieces
    sub_group_parts = sub_group.Get(Am_GRAPHICAL_PARTS);
    //save a copy in case undo
    sub_group.Set(Am_OBJECT_MODIFIED_PLACES, sub_group_parts,
                  Am_OK_IF_NOT_THERE);
    adjust_objects_positions(sub_group_parts, left, top);
    remove_and_add_objects(sub_group_parts, sub_group, group, place);
    new_selected_objs.Append(sub_group_parts);
    group.Remove_Part(sub_group);
  }

  cmd.Set(Am_OBJECT_MODIFIED_PLACES, selected_objs_places);
  cmd.Set(Am_VALUE, new_selected_objs); //all the objects affected
  //new selection is all the objects taken out of groups
  selection_widget.Set(Am_VALUE, new_selected_objs);
}